

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9Texture.cpp
# Opt level: O3

void __thiscall
GmmLib::GmmGen9TextureCalc::Fill2DTexOffsetAddress
          (GmmGen9TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  anon_struct_8_45_9b07292e_for_Gpu aVar1;
  anon_struct_8_44_94931171_for_Info aVar2;
  uint8_t uVar3;
  uint32_t uVar4;
  int iVar5;
  GMM_PLATFORM_INFO *pGVar6;
  GMM_GFX_SIZE_T GVar7;
  undefined4 extraout_var;
  ulong uVar8;
  uint32_t uVar9;
  uint uVar10;
  uint32_t local_3c;
  uint local_38;
  uint32_t CompressWidth;
  uint32_t CompressHeight;
  uint32_t CompressDepth;
  
  pGVar6 = GmmGetPlatformInfo((this->super_GmmTextureCalc).pGmmLibContext);
  if (pTexInfo->Type - RESOURCE_3D < 2 || 1 < pTexInfo->ArraySize) {
    uVar9 = (pTexInfo->Alignment).VAlign;
    if ((pTexInfo->Type != RESOURCE_3D) || (((pTexInfo->Flags).Info.field_0x2 & 8) != 0))
    goto LAB_001a6624;
    uVar10 = SUB84((pTexInfo->Flags).Gpu,0);
LAB_001a663e:
    uVar9 = pGVar6->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
    if ((uVar10 >> 0x1d & 1) != 0) {
      uVar9 = uVar9 << ((byte)((ulong)(pTexInfo->Flags).Info >> 0x22) & 1);
    }
  }
  else {
    if (((ulong)(pTexInfo->Flags).Gpu & 0x18) == 0) {
      (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Mip0SlicePitch = 0;
      (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[0] = 0;
      goto LAB_001a6734;
    }
    uVar9 = (pTexInfo->Alignment).VAlign;
LAB_001a6624:
    uVar10 = SUB84((pTexInfo->Flags).Gpu,0);
    if ((((uVar10 >> 0x19 & 1) != 0) &&
        (((uint)(((this->super_GmmTextureCalc).pGmmLibContext)->SkuTable).field_5 & 2) != 0)) ||
       (((pTexInfo->Flags).Wa.field_0x1 & 8) != 0)) goto LAB_001a663e;
  }
  uVar4 = Get2DMipMapTotalHeight(this,pTexInfo);
  if (uVar9 != 0) {
    uVar10 = (uVar9 - 1) + uVar4;
    uVar4 = uVar10 - uVar10 % uVar9;
  }
  (pTexInfo->Alignment).QPitch = uVar4;
  uVar3 = GmmIsCompressed((this->super_GmmTextureCalc).pGmmLibContext,pTexInfo->Format);
  if (uVar3 == '\0') {
    aVar1 = (pTexInfo->Flags).Gpu;
    if (((aVar1._0_4_ >> 0x1d & 1) == 0) ||
       (aVar2 = (pTexInfo->Flags).Info, ((ulong)aVar2 >> 0x22 & 1) == 0)) {
      uVar8 = (ulong)uVar4;
      if ((~(ulong)aVar1 & 0x20000000002) == 0) {
        uVar8 = (ulong)(uVar4 >> 4);
      }
    }
    else {
      uVar8 = (ulong)(uVar4 >> 1);
      if (((aVar2._0_4_ >> 0x13 & 1) == 0) && (pTexInfo->Type == RESOURCE_3D)) {
        (pTexInfo->Alignment).QPitch = uVar4 >> 1;
      }
    }
  }
  else {
    GmmTextureCalc::GetCompressionBlockDimensions
              (&this->super_GmmTextureCalc,pTexInfo->Format,&local_3c,&local_38,&CompressWidth);
    uVar8 = (ulong)uVar4 / (ulong)local_38;
    if ((pTexInfo->Type == RESOURCE_3D) && (((pTexInfo->Flags).Info.field_0x2 & 8) == 0)) {
      uVar9 = pGVar6->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
      uVar8 = (ulong)(-uVar9 & (int)uVar8 + -1 + uVar9);
    }
  }
  GVar7 = uVar8 * pTexInfo->Pitch;
  (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Mip0SlicePitch = GVar7;
  (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[0] = GVar7;
LAB_001a6734:
  uVar8 = 0;
  do {
    iVar5 = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[8])(this,pTexInfo,uVar8);
    *(ulong *)(pTexInfo->MmcHint + uVar8 * 8 + 0x80) = CONCAT44(extraout_var,iVar5);
    uVar10 = (int)uVar8 + 1;
    uVar8 = (ulong)uVar10;
  } while (uVar10 <= pTexInfo->MaxLod);
  return;
}

Assistant:

void GmmLib::GmmGen9TextureCalc::Fill2DTexOffsetAddress(GMM_TEXTURE_INFO *pTexInfo)
{
    uint32_t i;
    GMM_DPF_ENTER;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    // QPitch: Array Element-to-Element, or Cube Face-to-Face Pitch...
    if((pTexInfo->ArraySize <= 1) &&
       (pTexInfo->Type != RESOURCE_3D) &&
       (pTexInfo->Type != RESOURCE_CUBE) &&
       !(pTexInfo->Flags.Gpu.ColorSeparation ||
         pTexInfo->Flags.Gpu.ColorSeparationRGBX))
    {
        pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchRender =
        pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchLock = 0;
    }
    else
    {
        uint32_t ArrayQPitch, Alignment;

        Alignment = pTexInfo->Alignment.VAlign;
        if((pTexInfo->Type == RESOURCE_3D && !pTexInfo->Flags.Info.Linear) ||
           (pTexInfo->Flags.Gpu.S3dDx && pGmmLibContext->GetSkuTable().FtrDisplayEngineS3d) ||
	   (pTexInfo->Flags.Wa.MediaPipeUsage))
         {
            Alignment = pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
	    //Gmm uses TileY for Stencil allocations, having half TileW height (TileY width compensates)
            if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
            {
                Alignment *= 2;
            }
	}

        // Calculate the overall Block height...Mip0Height + Max(Mip1Height, Sum of Mip2Height..MipnHeight)
        ArrayQPitch = Get2DMipMapTotalHeight(pTexInfo);
        ArrayQPitch = GFX_ALIGN_NP2(ArrayQPitch, Alignment);
	    
	// Color Surf with MSAA Enabled Mutiply 4
        if (GMM_IS_64KB_TILE(pTexInfo->Flags) && (!pGmmLibContext->GetSkuTable().FtrTileY) && (!pGmmLibContext->GetSkuTable().FtrXe2PlusTiling) &&
           ((pTexInfo->MSAA.NumSamples == 8) || (pTexInfo->MSAA.NumSamples == 16)) &&
           ((pTexInfo->Flags.Gpu.Depth == 0) && (pTexInfo->Flags.Gpu.SeparateStencil == 0)))
        {
           // ArrayQPitch *= 4; /* Aligned height of 4 samples */
        }
	    
        pTexInfo->Alignment.QPitch = ArrayQPitch;

        if(GmmIsCompressed(pGmmLibContext, pTexInfo->Format))
        {
            uint32_t CompressWidth, CompressHeight, CompressDepth;

            GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

            ArrayQPitch /= CompressHeight;

            if((pTexInfo->Type == RESOURCE_3D) && !pTexInfo->Flags.Info.Linear)
            {
                ArrayQPitch = GFX_ALIGN(ArrayQPitch, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight);
            }
        }
        else if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
        {
            ArrayQPitch /= 2;
	    if(pTexInfo->Type == RESOURCE_3D && !pTexInfo->Flags.Info.Linear)
            {
                pTexInfo->Alignment.QPitch = ArrayQPitch;
            }
        }
        else if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
        {
            ArrayQPitch /= 16;
        }

        pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchRender =
        pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchLock = ArrayQPitch * pTexInfo->Pitch;
    }

    for(i = 0; i <= pTexInfo->MaxLod; i++)
    {
        pTexInfo->OffsetInfo.Texture2DOffsetInfo.Offset[i] = Get2DTexOffsetAddressPerMip(pTexInfo, i);
    }

    GMM_DPF_EXIT;
}